

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcmarker.c
# Opt level: O0

void write_marker_header(j_compress_ptr cinfo,int marker,uint datalen)

{
  uint in_EDX;
  undefined4 in_ESI;
  long *in_RDI;
  JPEG_MARKER in_stack_ffffffffffffffec;
  
  if (0xfffd < in_EDX) {
    *(undefined4 *)(*in_RDI + 0x28) = 0xc;
    (**(code **)*in_RDI)(in_RDI);
  }
  emit_marker((j_compress_ptr)CONCAT44(in_ESI,in_EDX),in_stack_ffffffffffffffec);
  emit_2bytes((j_compress_ptr)CONCAT44(in_ESI,in_EDX),in_stack_ffffffffffffffec);
  return;
}

Assistant:

METHODDEF(void)
write_marker_header (j_compress_ptr cinfo, int marker, unsigned int datalen)
/* Emit an arbitrary marker header */
{
  if (datalen > (unsigned int) 65533)		/* safety check */
    ERREXIT(cinfo, JERR_BAD_LENGTH);

  emit_marker(cinfo, (JPEG_MARKER) marker);

  emit_2bytes(cinfo, (int) (datalen + 2));	/* total length */
}